

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathInterval.h
# Opt level: O2

ostream * Imath_3_2::operator<<(ostream *s,Interval<short> *v)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(s,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->min);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->max);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Interval<T>& v)
{
    return s << '(' << v.min << ' ' << v.max << ')';
}